

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O1

int GetResponseDescriptorRPLIDAR
              (RPLIDAR *pRPLIDAR,int *pDataResponseLength,int *pSendMode,int *pDataType)

{
  byte bVar1;
  uint *puVar2;
  int iVar3;
  ssize_t sVar4;
  __time_t _Var5;
  long lVar6;
  long *plVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  size_t __n;
  CHRONO chrono;
  uchar recvbuf [1024];
  timespec local_4a8;
  RPLIDAR *local_498;
  uint *local_490;
  uint *local_488;
  timespec local_480;
  undefined8 local_470;
  undefined8 uStack_468;
  long local_460;
  long lStack_458;
  timespec local_450;
  int local_440;
  char local_438 [1032];
  
  local_488 = (uint *)pSendMode;
  iVar3 = clock_getres(4,&local_450);
  if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_480), iVar3 == 0)) {
    local_440 = 0;
    local_470 = 0;
    uStack_468 = 0;
    local_460 = 0;
    lStack_458 = 0;
  }
  uVar11 = 0;
  memset(local_438,0,0x400);
  iVar3 = (pRPLIDAR->RS232Port).DevType;
  iVar13 = 1;
  if (iVar3 - 1U < 4) {
    iVar3 = (pRPLIDAR->RS232Port).s;
    do {
      sVar4 = recv(iVar3,local_438 + uVar11,(long)(7 - (int)uVar11),0);
      if ((int)sVar4 < 1) goto LAB_0012cc1b;
      uVar10 = (int)uVar11 + (int)sVar4;
      uVar11 = (ulong)uVar10;
    } while ((int)uVar10 < 7);
  }
  else {
    if (iVar3 != 0) {
      pcVar12 = "Error reading data from a RPLIDAR. ";
      goto LAB_0012cc36;
    }
    iVar3 = *(int *)&(pRPLIDAR->RS232Port).hDev;
    uVar11 = 0;
    do {
      sVar4 = read(iVar3,local_438 + uVar11,(ulong)(7 - (int)uVar11));
      if ((int)sVar4 < 1) goto LAB_0012cc1b;
      uVar10 = (int)uVar11 + (int)sVar4;
      uVar11 = (ulong)uVar10;
    } while (uVar10 < 7);
  }
  local_498 = pRPLIDAR;
  iVar3 = 7;
  local_490 = (uint *)pDataType;
  do {
    puVar2 = local_490;
    uVar10 = 0;
    pcVar12 = local_438;
    do {
      *pDataResponseLength = 0;
      if ((int)(iVar3 - uVar10) < 7) {
        uVar8 = 7 - (iVar3 - uVar10);
        iVar13 = 6;
        lVar6 = 0;
      }
      else if ((*pcVar12 == -0x5b) && (pcVar12[1] == 'Z')) {
        bVar1 = pcVar12[5];
        *pDataResponseLength =
             (bVar1 & 0x3f) << 0x18 | (uint)(byte)pcVar12[4] << 0x10 | (uint)(byte)pcVar12[3] << 8 |
             (uint)(byte)pcVar12[2];
        *local_488 = (uint)(bVar1 >> 6);
        *puVar2 = (uint)(byte)pcVar12[6];
        lVar6 = 0;
        uVar8 = 0xffffffff;
        iVar13 = 0;
      }
      else {
        puts("Warning : RPLIDAR bad start flag. ");
        lVar6 = 1;
        uVar8 = 0xffffffff;
        iVar13 = 1;
      }
      uVar9 = 0xffffffff;
      if ((iVar13 == 0) || (uVar9 = uVar8, iVar13 == 6)) goto LAB_0012ca3f;
      pcVar12 = pcVar12 + lVar6;
      uVar10 = uVar10 + (int)lVar6;
    } while ((int)uVar10 < iVar3);
    iVar13 = 1;
    uVar9 = 0xffffffff;
LAB_0012ca3f:
    if (iVar13 == 1) {
      uVar9 = 7;
      if ((int)uVar10 < 7) {
        uVar9 = uVar10;
      }
    }
    else if (iVar13 == 0) {
      if ((int)(iVar3 - uVar10) < 8) {
        return 0;
      }
      pcVar12 = 
      "Warning getting data from a RPLIDAR : Unexpected data after a response descriptor. ";
      iVar13 = 0;
      goto LAB_0012cc36;
    }
    __n = (size_t)(int)(iVar3 - uVar10);
    memmove(local_438,local_438 + (int)uVar10,__n);
    iVar3 = (iVar3 - uVar10) + uVar9;
    if (0x3ff < iVar3) {
      iVar13 = 4;
      pcVar12 = "Error reading data from a RPLIDAR : Invalid data. ";
      goto LAB_0012cc36;
    }
    iVar13 = (local_498->RS232Port).DevType;
    if (iVar13 - 1U < 4) {
      if (0 < (int)uVar9) {
        iVar13 = (local_498->RS232Port).s;
        uVar11 = 0;
        do {
          sVar4 = recv(iVar13,local_438 + uVar11 + __n,(long)(int)(uVar9 - (int)uVar11),0);
          if ((int)sVar4 < 1) goto LAB_0012cc24;
          uVar10 = (int)uVar11 + (int)sVar4;
          uVar11 = (ulong)uVar10;
        } while ((int)uVar10 < (int)uVar9);
      }
    }
    else {
      if (iVar13 != 0) {
LAB_0012cc24:
        pcVar12 = "Error reading data from a RPLIDAR. ";
        iVar13 = 1;
        goto LAB_0012cc36;
      }
      if (uVar9 != 0) {
        iVar13 = *(int *)&(local_498->RS232Port).hDev;
        uVar11 = 0;
        do {
          sVar4 = read(iVar13,local_438 + uVar11 + __n,(ulong)(uVar9 - (int)uVar11));
          if ((int)sVar4 < 1) goto LAB_0012cc24;
          uVar10 = (int)uVar11 + (int)sVar4;
          uVar11 = (ulong)uVar10;
        } while (uVar10 < uVar9);
      }
    }
    if (local_440 == 0) {
      clock_gettime(4,&local_4a8);
      local_4a8.tv_sec =
           (local_4a8.tv_sec + local_460 + (local_4a8.tv_nsec + lStack_458) / 1000000000) -
           local_480.tv_sec;
      local_4a8.tv_nsec = (local_4a8.tv_nsec + lStack_458) % 1000000000 - local_480.tv_nsec;
      if (local_4a8.tv_nsec < 0) {
        local_4a8.tv_sec = local_4a8.tv_sec + local_4a8.tv_nsec / 1000000000 + -1;
        local_4a8.tv_nsec = local_4a8.tv_nsec % 1000000000 + 1000000000;
      }
      plVar7 = &local_4a8.tv_nsec;
      _Var5 = local_4a8.tv_sec;
    }
    else {
      plVar7 = &lStack_458;
      _Var5 = local_460;
    }
  } while ((double)*plVar7 / 1000000000.0 + (double)_Var5 <= 4.0);
  iVar13 = 2;
  pcVar12 = "Error reading data from a RPLIDAR : Response descriptor timeout. ";
LAB_0012cc36:
  puts(pcVar12);
  return iVar13;
LAB_0012cc1b:
  pcVar12 = "Error reading data from a RPLIDAR. ";
  goto LAB_0012cc36;
}

Assistant:

inline int GetResponseDescriptorRPLIDAR(RPLIDAR* pRPLIDAR, int* pDataResponseLength, int* pSendMode, int* pDataType)
{
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired response descriptor...

	nbBytesToRequest = NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindResponseDescriptorRPLIDAR(recvbuf, BytesReceived, pDataResponseLength, pSendMode, pDataType, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Response descriptor timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a response descriptor. \n");
	}

	return EXIT_SUCCESS;
}